

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O1

int SHA1_Final(SHA1_CTX *context,uint8_t *digest)

{
  undefined1 auVar1 [64];
  int iVar2;
  long in_RAX;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  uint8_t c;
  uint8_t finalcount [8];
  undefined1 local_29;
  undefined8 local_28;
  
  vpmovsxbd_avx2(ZEXT816(0x1010101));
  auVar5 = vpgatherdd_avx512vl(context->count[in_RAX]);
  auVar5 = vpsrlvd_avx2(auVar5,_DAT_001a0040);
  auVar4 = vpmovdb_avx512vl(auVar5);
  local_28 = auVar4._0_8_;
  local_29 = 0x80;
  SHA1_Update((SHA_CTX *)context,&local_29,1);
  if ((context->count[0] & 0x1f8) != 0x1c0) {
    do {
      local_29 = 0;
      SHA1_Update((SHA_CTX *)context,&local_29,1);
    } while ((context->count[0] & 0x1f8) != 0x1c0);
  }
  SHA1_Update((SHA_CTX *)context,&local_28,8);
  iVar2 = 0;
  lVar3 = 0;
  do {
    digest[lVar3] =
         (uint8_t)(*(uint *)((long)context->state + (ulong)((uint)lVar3 & 0xfffffffc)) >>
                  (~(byte)iVar2 & 0x18));
    lVar3 = lVar3 + 1;
    iVar2 = iVar2 + 8;
  } while (lVar3 != 0x14);
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  *(undefined1 (*) [64])context->buffer = auVar1;
  auVar1 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  context->state[0] = auVar1._0_4_;
  context->state[1] = auVar1._4_4_;
  context->state[2] = auVar1._8_4_;
  context->state[3] = auVar1._12_4_;
  context->state[4] = auVar1._16_4_;
  context->count[0] = auVar1._20_4_;
  context->count[1] = auVar1._24_4_;
  context->buffer[0] = auVar1[0x1c];
  context->buffer[1] = auVar1[0x1d];
  context->buffer[2] = auVar1[0x1e];
  context->buffer[3] = auVar1[0x1f];
  context->buffer[4] = auVar1[0x20];
  context->buffer[5] = auVar1[0x21];
  context->buffer[6] = auVar1[0x22];
  context->buffer[7] = auVar1[0x23];
  context->buffer[8] = auVar1[0x24];
  context->buffer[9] = auVar1[0x25];
  context->buffer[10] = auVar1[0x26];
  context->buffer[0xb] = auVar1[0x27];
  context->buffer[0xc] = auVar1[0x28];
  context->buffer[0xd] = auVar1[0x29];
  context->buffer[0xe] = auVar1[0x2a];
  context->buffer[0xf] = auVar1[0x2b];
  context->buffer[0x10] = auVar1[0x2c];
  context->buffer[0x11] = auVar1[0x2d];
  context->buffer[0x12] = auVar1[0x2e];
  context->buffer[0x13] = auVar1[0x2f];
  context->buffer[0x14] = auVar1[0x30];
  context->buffer[0x15] = auVar1[0x31];
  context->buffer[0x16] = auVar1[0x32];
  context->buffer[0x17] = auVar1[0x33];
  context->buffer[0x18] = auVar1[0x34];
  context->buffer[0x19] = auVar1[0x35];
  context->buffer[0x1a] = auVar1[0x36];
  context->buffer[0x1b] = auVar1[0x37];
  context->buffer[0x1c] = auVar1[0x38];
  context->buffer[0x1d] = auVar1[0x39];
  context->buffer[0x1e] = auVar1[0x3a];
  context->buffer[0x1f] = auVar1[0x3b];
  context->buffer[0x20] = auVar1[0x3c];
  context->buffer[0x21] = auVar1[0x3d];
  context->buffer[0x22] = auVar1[0x3e];
  context->buffer[0x23] = auVar1[0x3f];
  return iVar2;
}

Assistant:

void SHA1_Final(SHA1_CTX *context, uint8_t digest[SHA1_DIGEST_SIZE]) {
  unsigned i;
  uint8_t finalcount[8];
  uint8_t c;

  for (i = 0; i < 8; i++) {
    finalcount[i] =
        /* Endian independent */
        (uint8_t)(context->count[(i >= 4 ? 0 : 1)] >> ((3 - (i & 3)) * 8));
  }
  c = 0200;
  SHA1_Update(context, &c, 1);
  while ((context->count[0] & 504) != 448) {
    c = 0000;
    SHA1_Update(context, &c, 1);
  }
  SHA1_Update(context, finalcount, 8); /* Should cause a SHA1_Transform() */
  for (i = 0; i < 20; i++) {
    digest[i] = (uint8_t)(context->state[i >> 2] >> ((3 - (i & 3)) * 8));
  }
  /* Wipe variables */
  memset(context, '\0', sizeof(*context));
  memset(&finalcount, '\0', sizeof(finalcount));
}